

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderGetAttributeNs
                    (xmlTextReaderPtr reader,xmlChar *localName,xmlChar *namespaceURI)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlNs *local_38;
  xmlNsPtr ns;
  xmlChar *prefix;
  xmlChar *namespaceURI_local;
  xmlChar *localName_local;
  xmlTextReaderPtr reader_local;
  
  ns = (xmlNsPtr)0x0;
  if ((reader == (xmlTextReaderPtr)0x0) || (localName == (xmlChar *)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->curnode == (xmlNodePtr)0x0) {
    if (reader->node->type == XML_ELEMENT_NODE) {
      iVar1 = xmlStrEqual(namespaceURI,(xmlChar *)"http://www.w3.org/2000/xmlns/");
      if (iVar1 == 0) {
        reader_local = (xmlTextReaderPtr)xmlGetNsProp(reader->node,localName,namespaceURI);
      }
      else {
        iVar1 = xmlStrEqual(localName,"xmlns");
        if (iVar1 == 0) {
          ns = (xmlNsPtr)localName;
        }
        for (local_38 = reader->node->nsDef; local_38 != (xmlNs *)0x0; local_38 = local_38->next) {
          if (((ns == (xmlNsPtr)0x0) && (local_38->prefix == (xmlChar *)0x0)) ||
             ((local_38->prefix != (xmlChar *)0x0 &&
              (iVar1 = xmlStrEqual(local_38->prefix,localName), iVar1 != 0)))) {
            pxVar2 = xmlStrdup(local_38->href);
            return pxVar2;
          }
        }
        reader_local = (xmlTextReaderPtr)0x0;
      }
    }
    else {
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  else {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderGetAttributeNs(xmlTextReaderPtr reader, const xmlChar *localName,
			    const xmlChar *namespaceURI) {
    xmlChar *prefix = NULL;
    xmlNsPtr ns;

    if ((reader == NULL) || (localName == NULL))
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	return(NULL);

    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(NULL);

    if (xmlStrEqual(namespaceURI, BAD_CAST "http://www.w3.org/2000/xmlns/")) {
		if (! xmlStrEqual(localName, BAD_CAST "xmlns")) {
			prefix = BAD_CAST localName;
		}
		ns = reader->node->nsDef;
		while (ns != NULL) {
			if ((prefix == NULL && ns->prefix == NULL) ||
				((ns->prefix != NULL) && (xmlStrEqual(ns->prefix, localName)))) {
				return xmlStrdup(ns->href);
			}
			ns = ns->next;
		}
		return NULL;
    }

    return(xmlGetNsProp(reader->node, localName, namespaceURI));
}